

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_iterator_suite.cpp
# Opt level: O2

void concept_const_suite::random_access_iterator_greater(void)

{
  bool bVar1;
  initializer_list<int> __l;
  const_iterator local_78;
  const_iterator local_68;
  circular_view<int,_18446744073709551615UL> span;
  vector<int,_std::allocator<int>_> data;
  
  span.member.data = (pointer)0x160000000b;
  span.member.cap = 0x2c00000021;
  __l._M_len = 4;
  __l._M_array = (iterator)&span;
  std::vector<int,_std::allocator<int>_>::vector(&data,__l,(allocator_type *)&local_78);
  span.member.data = (pointer)0x0;
  if ((long)data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != 0) {
    span.member.data =
         data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    ;
  }
  span.member.cap =
       (long)data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start >> 2;
  span.member.size = span.member.cap;
  span.member.next = span.member.cap;
  local_78 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_68 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator>
                    (&local_78,&local_68);
  boost::detail::test_impl
            ("!(span.begin() > span.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x229,"void concept_const_suite::random_access_iterator_greater()",!bVar1);
  local_78 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_68 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator>
                    (&local_78,&local_68);
  boost::detail::test_impl
            ("!(span.begin() > span.end())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x22a,"void concept_const_suite::random_access_iterator_greater()",!bVar1);
  local_78 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  local_68 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator>
                    (&local_78,&local_68);
  boost::detail::test_impl
            ("span.end() > span.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x22b,"void concept_const_suite::random_access_iterator_greater()",bVar1);
  local_78 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  local_68 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator>
                    (&local_78,&local_68);
  boost::detail::test_impl
            ("!(span.end() > span.end())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x22c,"void concept_const_suite::random_access_iterator_greater()",!bVar1);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&data.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void random_access_iterator_greater()
{
    // a > b
    std::vector<int> data = { 11, 22, 33, 44 };
    const circular_view<int> span(data.begin(), data.end(), data.begin(), data.size());
    BOOST_TEST(!(span.begin() > span.begin()));
    BOOST_TEST(!(span.begin() > span.end()));
    BOOST_TEST(span.end() > span.begin());
    BOOST_TEST(!(span.end() > span.end()));
}